

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O3

FT_Error ft_var_load_hvvar(TT_Face face,FT_Bool vertical)

{
  FT_Stream stream;
  FT_Memory pFVar1;
  GX_Blend pGVar2;
  FT_UShort FVar3;
  FT_Error FVar4;
  GX_HVVarTable itemStore;
  uint uVar5;
  undefined7 in_register_00000031;
  FT_ULong FVar6;
  bool bVar7;
  FT_ULong local_58;
  FT_ULong table_len;
  FT_ULong local_48;
  FT_ULong local_40;
  FT_Error local_34;
  
  stream = (face->root).stream;
  pFVar1 = stream->memory;
  pGVar2 = face->blend;
  bVar7 = (int)CONCAT71(in_register_00000031,vertical) != 0;
  FVar6 = 0x56564152;
  if (!bVar7) {
    FVar6 = 0x48564152;
  }
  (&pGVar2->hvar_loaded)[(ulong)bVar7 * 0x10] = '\x01';
  local_34 = (*face->goto_table)(face,FVar6,stream,&local_58);
  if (local_34 == 0) {
    table_len = (FT_ULong)pFVar1;
    local_40 = FT_Stream_Pos(stream);
    FVar3 = FT_Stream_ReadUShort(stream,&local_34);
    if (((local_34 == 0) && (FVar4 = FT_Stream_Skip(stream,2), local_34 = FVar4, FVar4 == 0)) &&
       (local_34 = 8, FVar3 == 1)) {
      local_34 = FVar4;
      FVar6 = FT_Stream_ReadULong(stream,&local_34);
      if ((local_34 == 0) && (local_48 = FT_Stream_ReadULong(stream,&local_34), local_34 == 0)) {
        itemStore = (GX_HVVarTable)ft_mem_alloc((FT_Memory)table_len,0x38,&local_34);
        if (vertical == '\0') {
          pGVar2->hvar_table = itemStore;
        }
        else {
          pGVar2->vvar_table = itemStore;
        }
        if ((local_34 == 0) &&
           (local_34 = ft_var_load_item_variation_store
                                 ((TT_Face)(face->root).stream,(FT_ULong)face->blend,
                                  (GX_ItemVarStore)(FVar6 + local_40)), local_34 == 0)) {
          if ((local_48 != 0) &&
             (FVar4 = ft_var_load_delta_set_index_mapping
                                ((TT_Face)(face->root).stream,local_48 + local_40,
                                 &itemStore->widthMap,(GX_ItemVarStore)itemStore), FVar4 != 0)) {
            return FVar4;
          }
          uVar5 = 0x10;
          if (vertical == '\0') {
            uVar5 = 2;
          }
          (&pGVar2->hvar_checked)[(ulong)(vertical != '\0') * 0x10] = '\x01';
          face->variation_support = face->variation_support | uVar5;
          local_34 = 0;
        }
      }
    }
  }
  return local_34;
}

Assistant:

static FT_Error
  ft_var_load_hvvar( TT_Face  face,
                     FT_Bool  vertical )
  {
    FT_Stream  stream = FT_FACE_STREAM( face );
    FT_Memory  memory = stream->memory;

    GX_Blend  blend = face->blend;

    GX_HVVarTable  table;

    FT_Error   error;
    FT_UShort  majorVersion;
    FT_ULong   table_len;
    FT_ULong   table_offset;
    FT_ULong   store_offset;
    FT_ULong   widthMap_offset;


    if ( vertical )
    {
      blend->vvar_loaded = TRUE;

      FT_TRACE2(( "VVAR " ));

      error = face->goto_table( face, TTAG_VVAR, stream, &table_len );
    }
    else
    {
      blend->hvar_loaded = TRUE;

      FT_TRACE2(( "HVAR " ));

      error = face->goto_table( face, TTAG_HVAR, stream, &table_len );
    }

    if ( error )
    {
      FT_TRACE2(( "is missing\n" ));
      goto Exit;
    }

    table_offset = FT_STREAM_POS();

    /* skip minor version */
    if ( FT_READ_USHORT( majorVersion ) ||
         FT_STREAM_SKIP( 2 )            )
      goto Exit;

    if ( majorVersion != 1 )
    {
      FT_TRACE2(( "bad table version %d\n", majorVersion ));
      error = FT_THROW( Invalid_Table );
      goto Exit;
    }

    if ( FT_READ_ULONG( store_offset )    ||
         FT_READ_ULONG( widthMap_offset ) )
      goto Exit;

    if ( vertical )
    {
      if ( FT_NEW( blend->vvar_table ) )
        goto Exit;
      table = blend->vvar_table;
    }
    else
    {
      if ( FT_NEW( blend->hvar_table ) )
        goto Exit;
      table = blend->hvar_table;
    }

    error = ft_var_load_item_variation_store(
              face,
              table_offset + store_offset,
              &table->itemStore );
    if ( error )
      goto Exit;

    if ( widthMap_offset )
    {
      error = ft_var_load_delta_set_index_mapping(
                face,
                table_offset + widthMap_offset,
                &table->widthMap,
                &table->itemStore );
      if ( error )
        goto Exit;
    }

    FT_TRACE2(( "loaded\n" ));
    error = FT_Err_Ok;

  Exit:
    if ( !error )
    {
      if ( vertical )
      {
        blend->vvar_checked = TRUE;

        /* FreeType doesn't provide functions to quickly retrieve    */
        /* TSB, BSB, or VORG values; we thus don't have to implement */
        /* support for those three item variation stores.            */

        face->variation_support |= TT_FACE_FLAG_VAR_VADVANCE;
      }
      else
      {
        blend->hvar_checked = TRUE;

        /* FreeType doesn't provide functions to quickly retrieve */
        /* LSB or RSB values; we thus don't have to implement     */
        /* support for those two item variation stores.           */

        face->variation_support |= TT_FACE_FLAG_VAR_HADVANCE;
      }
    }

    return error;
  }